

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35d0fd::DirectoryTreeStructureSignatureTask::provideValue
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key
          ,ValueType *valueData)

{
  pointer *ppSVar1;
  char *pcVar2;
  Twine *pTVar3;
  Child *pCVar4;
  Child *pCVar5;
  Child CVar6;
  Child CVar7;
  Child CVar8;
  Child *pCVar9;
  pointer pSVar10;
  Child *pCVar11;
  bool bVar12;
  ulong uVar13;
  FileInfo *this_00;
  pointer pSVar14;
  undefined8 *puVar15;
  uintptr_t uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  StringRef name;
  StringRef str;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filenames;
  SmallString<256U> childPath;
  BuildValue value;
  Child local_288;
  Child local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  Child CStack_270;
  Twine *local_268;
  Twine *pTStack_260;
  Twine *local_258;
  Twine *local_250;
  Child CStack_248;
  Twine *local_240;
  char local_238;
  uintptr_t local_230;
  Child local_228;
  long local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Child local_208;
  Twine *local_200;
  long local_1f8;
  TaskInterface local_1f0;
  Twine local_1e0;
  BinaryDecoder local_1c8 [11];
  BuildValue local_b8;
  Twine local_48;
  
  local_1f0.ctx = ti.ctx;
  local_1f0.impl = ti.impl;
  if (inputID == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directoryValue,valueData);
    local_1c8[0].data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_1c8[0].data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_1c8[0].data.Data;
    local_1c8[0].pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_b8,local_1c8);
    if ((int)local_b8.kind < 0xe) {
      if (local_b8.kind == MissingInput) goto LAB_001a3c97;
      if (local_b8.kind != DirectoryContents) {
LAB_001a36f8:
        __assert_fail("value.isFilteredDirectoryContents() || value.isDirectoryContents()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                      ,0x5a4,
                      "virtual void (anonymous namespace)::DirectoryTreeStructureSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                     );
      }
    }
    else {
      if (local_b8.kind == SkippedCommand) goto LAB_001a3c97;
      if (local_b8.kind != FilteredDirectoryContents) goto LAB_001a36f8;
    }
    llbuild::buildsystem::BuildValue::getDirectoryContents
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_208,&local_b8);
    if (local_200 != local_208.twine) {
      uVar16 = 0;
      do {
        local_1c8[0].data.Data = (char *)&local_1c8[0].pos;
        pcVar2 = (this->path)._M_dataplus._M_p;
        local_1c8[0].data.Length._0_4_ = 0;
        local_1c8[0].data.Length._4_4_ = 0x100;
        llvm::SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_1c8,pcVar2,pcVar2 + (this->path)._M_string_length)
        ;
        local_230 = uVar16;
        llvm::Twine::Twine((Twine *)&local_288,(StringRef *)(&(local_208.twine)->LHS + uVar16 * 2));
        llvm::Twine::Twine((Twine *)&local_228,"");
        llvm::Twine::Twine(&local_1e0,"");
        llvm::Twine::Twine(&local_48,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_1c8,(Twine *)&local_288,(Twine *)&local_228,
                   &local_1e0,&local_48);
        pTVar3 = (&(local_208.twine)->LHS)[uVar16 * 2].twine;
        if (pTVar3 == (Twine *)0x0) {
          local_288.twine = (Twine *)&local_278;
          local_280.twine = (Twine *)0x0;
          local_278 = 0;
        }
        else {
          local_288.twine = (Twine *)&local_278;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,pTVar3,
                     (long)&pTVar3->LHS + (long)(&(local_208.twine)->RHS)[uVar16 * 2].twine);
        }
        local_238 = '\0';
        local_268 = (Twine *)0x0;
        pTStack_260 = (Twine *)0x0;
        local_258 = (Twine *)0x0;
        pCVar4 = (Child *)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar4 == (Child *)(this->childResults).
                               super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pCVar5 = (Child *)(this->childResults).
                            super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
          if ((long)pCVar4 - (long)pCVar5 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar18 = (long)pCVar4 - (long)pCVar5 >> 3;
          uVar19 = lVar18 * 0x2e8ba2e8ba2e8ba3;
          uVar13 = uVar19;
          if (pCVar4 == pCVar5) {
            uVar13 = 1;
          }
          uVar17 = uVar13 + uVar19;
          if (0x1745d1745d1745c < uVar17) {
            uVar17 = 0x1745d1745d1745d;
          }
          if (CARRY8(uVar13,uVar19)) {
            uVar17 = 0x1745d1745d1745d;
          }
          if (uVar17 == 0) {
            pSVar14 = (pointer)0x0;
          }
          else {
            pSVar14 = (pointer)operator_new(uVar17 * 0x58);
          }
          lVar18 = lVar18 * 8;
          pCVar11 = (Child *)((long)&(pSVar14->directoryStructureSignatureValue).Storage.storage +
                             lVar18 + -0x38);
          puVar15 = (undefined8 *)
                    ((long)&(pSVar14->directoryStructureSignatureValue).Storage.storage +
                    lVar18 + -0x38);
          *puVar15 = puVar15 + 2;
          if (local_288.twine == (Twine *)&local_278) {
            puVar15[2] = CONCAT71(uStack_277,local_278);
            *(Child *)(puVar15 + 3) = CStack_270;
          }
          else {
            pCVar11->twine = (Twine *)local_288;
            CVar8._1_7_ = uStack_277;
            CVar8.character = local_278;
            pCVar11[2] = CVar8;
          }
          pCVar11[1] = local_280;
          local_280.twine = (Twine *)0x0;
          local_278 = 0;
          pCVar11[4].twine = local_268;
          pCVar11[5].twine = pTStack_260;
          pCVar11[6].twine = local_258;
          local_258 = (Twine *)0x0;
          local_268 = (Twine *)0x0;
          pTStack_260 = (Twine *)0x0;
          pCVar11[10].character = local_238;
          pCVar9 = pCVar5;
          local_288.twine = (Twine *)&local_278;
          pSVar10 = pSVar14;
          if (local_238 == '\x01') {
            pCVar11[7].twine = local_250;
            pCVar11[8] = CStack_248;
            pCVar11[9].twine = local_240;
            local_250 = (Twine *)0x0;
            CStack_248.twine = (Twine *)0x0;
            local_240 = (Twine *)0x0;
          }
          for (; pCVar11 = pCVar5, pCVar4 != pCVar9; pCVar9 = pCVar9 + 0xb) {
            (pSVar10->filename)._M_dataplus._M_p = (pointer)&(pSVar10->filename).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pSVar10,pCVar9->twine,
                       (long)&pCVar9->twine->LHS + (long)&(pCVar9[1].twine)->LHS);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&pSVar10->value,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pCVar9 + 4));
            llvm::optional_detail::
            OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::
            OptionalStorage(&(pSVar10->directoryStructureSignatureValue).Storage,
                            (OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                             *)(pCVar9 + 7));
            pSVar10 = pSVar10 + 1;
          }
          for (; pCVar4 != pCVar11; pCVar11 = pCVar11 + 0xb) {
            if ((bool)pCVar11[10].character == true) {
              pTVar3 = pCVar11[7].twine;
              if (pTVar3 != (Twine *)0x0) {
                operator_delete(pTVar3,(long)pCVar11[9].twine - (long)pTVar3);
              }
              pCVar11[10].character = false;
            }
            pTVar3 = pCVar11[4].twine;
            if (pTVar3 != (Twine *)0x0) {
              operator_delete(pTVar3,(long)pCVar11[6].twine - (long)pTVar3);
            }
            if (pCVar11 + 2 != &pCVar11->twine->LHS) {
              operator_delete(&pCVar11->twine->LHS,(ulong)((long)&(pCVar11[2].twine)->LHS + 1));
            }
          }
          if (pCVar5 != (Child *)0x0) {
            operator_delete(pCVar5,(long)(this->childResults).
                                         super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pCVar5);
          }
          (this->childResults).
          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar14;
          (this->childResults).
          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar10 + 1;
          (this->childResults).
          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar14 + uVar17;
        }
        else {
          pCVar4->twine = (Twine *)(pCVar4 + 2);
          if (local_288.twine == (Twine *)&local_278) {
            CVar7._1_7_ = uStack_277;
            CVar7.character = local_278;
            pCVar4[2] = CVar7;
            pCVar4[3] = CStack_270;
          }
          else {
            pCVar4->twine = (Twine *)local_288;
            CVar6._1_7_ = uStack_277;
            CVar6.character = local_278;
            pCVar4[2] = CVar6;
          }
          pCVar4[1] = local_280;
          local_280.twine = (Twine *)0x0;
          local_278 = 0;
          pCVar4[4].twine = (Twine *)0x0;
          pCVar4[5].twine = (Twine *)0x0;
          pCVar4[6].twine = (Twine *)0x0;
          local_258 = (Twine *)0x0;
          local_268 = (Twine *)0x0;
          pTStack_260 = (Twine *)0x0;
          pCVar4[10].character = false;
          ppSVar1 = &(this->childResults).
                     super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
          local_288.twine = (Twine *)&local_278;
        }
        uVar16 = local_230;
        if (local_238 == '\x01') {
          if (local_250 != (Twine *)0x0) {
            operator_delete(local_250,(long)local_240 - (long)local_250);
          }
          local_238 = '\0';
        }
        if (local_268 != (Twine *)0x0) {
          operator_delete(local_268,(long)local_258 - (long)local_268);
        }
        if (local_288.twine != (Twine *)&local_278) {
          operator_delete(local_288.twine,CONCAT71(uStack_277,local_278) + 1);
        }
        str.Length._0_4_ = (undefined4)local_1c8[0].data.Length;
        str.Data = local_1c8[0].data.Data;
        str.Length._4_4_ = 0;
        llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)&local_228,'N',str);
        local_288.twine = (Twine *)&local_278;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,local_228.twine,(long)&(local_228.twine)->LHS + local_220);
        uVar16 = uVar16 + 1;
        llbuild::core::TaskInterface::request(&local_1f0,(KeyType *)&local_288,uVar16);
        if (local_288.twine != (Twine *)&local_278) {
          operator_delete(local_288.twine,CONCAT71(uStack_277,local_278) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.twine != &local_218) {
          operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
        }
        if ((uint64_t *)local_1c8[0].data.Data != &local_1c8[0].pos) {
          free(local_1c8[0].data.Data);
        }
      } while (uVar16 != (long)local_200 - (long)local_208 >> 4);
    }
    if (local_208.twine != (Twine *)0x0) {
      operator_delete(local_208.twine,local_1f8 - (long)local_208);
    }
  }
  else {
    pSVar14 = (this->childResults).
              super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = ((long)(this->childResults).
                    super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14 >> 3) *
             0x2e8ba2e8ba2e8ba3;
    if (uVar13 + 1 <= inputID) {
      if (~uVar13 + inputID < uVar13) {
        llvm::optional_detail::
        OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::
        operator=(&pSVar14[~uVar13 + inputID].directoryStructureSignatureValue.Storage,valueData);
        return;
      }
      __assert_fail("index < childResults.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x5c7,
                    "virtual void (anonymous namespace)::DirectoryTreeStructureSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                   );
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pSVar14[inputID - 1].value,valueData);
    local_1c8[0].data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_1c8[0].data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_1c8[0].data.Data;
    local_1c8[0].pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_b8,local_1c8);
    if (local_b8.kind == ExistingInput) {
      this_00 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_b8);
      bVar12 = llbuild::basic::FileInfo::isDirectory(this_00);
      if (bVar12) {
        pcVar2 = (this->path)._M_dataplus._M_p;
        local_1c8[0].data.Data = (char *)&local_1c8[0].pos;
        local_1c8[0].data.Length._0_4_ = 0;
        local_1c8[0].data.Length._4_4_ = 0x100;
        llvm::SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_1c8,pcVar2,pcVar2 + (this->path)._M_string_length)
        ;
        llvm::Twine::Twine((Twine *)&local_288,&pSVar14[inputID - 1].filename);
        llvm::Twine::Twine((Twine *)&local_228,"");
        llvm::Twine::Twine((Twine *)&local_208,"");
        llvm::Twine::Twine(&local_1e0,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_1c8,(Twine *)&local_288,(Twine *)&local_228,
                   (Twine *)&local_208,&local_1e0);
        name.Length._0_4_ = (undefined4)local_1c8[0].data.Length;
        name.Data = local_1c8[0].data.Data;
        name.Length._4_4_ = 0;
        llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
                  ((BuildKey *)&local_228,'s',name,&this->filters);
        local_288.twine = (Twine *)&local_278;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,local_228.twine,(long)&(local_228.twine)->LHS + local_220);
        llbuild::core::TaskInterface::request
                  (&local_1f0,(KeyType *)&local_288,
                   ((long)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->childResults).
                          super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 +
                   inputID);
        if (local_288.twine != (Twine *)&local_278) {
          operator_delete(local_288.twine,CONCAT71(uStack_277,local_278) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.twine != &local_218) {
          operator_delete(local_228.twine,local_218._M_allocated_capacity + 1);
        }
        if ((uint64_t *)local_1c8[0].data.Data != &local_1c8[0].pos) {
          free(local_1c8[0].data.Data);
        }
      }
    }
  }
LAB_001a3c97:
  llbuild::buildsystem::BuildValue::~BuildValue(&local_b8);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // The first input is the directory contents.
    if (inputID == 0) {
      // Record the value for the directory.
      directoryValue = valueData;

      // Request the inputs for each subpath.
      auto value = BuildValue::fromData(valueData);
      if (value.isMissingInput() || value.isSkippedCommand())
        return;

      assert(value.isFilteredDirectoryContents() || value.isDirectoryContents());
      auto filenames = value.getDirectoryContents();
      for (size_t i = 0; i != filenames.size(); ++i) {
        SmallString<256> childPath{ path };
        llvm::sys::path::append(childPath, filenames[i]);
        childResults.emplace_back(SubpathInfo{ filenames[i], {}, None });
        ti.request(BuildKey::makeNode(childPath).toData(), /*inputID=*/1 + i);
      }
      return;
    }

    // If the input is a child, add it to the collection and dispatch a
    // directory structure request if needed.
    if (inputID >= 1 && inputID < 1 + childResults.size()) {
      auto index = inputID - 1;
      auto& childResult = childResults[index];
      childResult.value = valueData;

      // If this node is a directory, request its signature recursively.
      auto value = BuildValue::fromData(valueData);
      if (value.isExistingInput()) {
        if (value.getOutputInfo().isDirectory()) {
          SmallString<256> childPath{ path };
          llvm::sys::path::append(childPath, childResult.filename);
        
          ti.request(
            BuildKey::makeDirectoryTreeStructureSignature(childPath, filters).toData(),
            /*inputID=*/1 + childResults.size() + index);
        }
      }
      return;
    }

    // Otherwise, the input should be a directory signature.
    auto index = inputID - 1 - childResults.size();
    assert(index < childResults.size());
    childResults[index].directoryStructureSignatureValue = valueData;
  }